

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmn.c
# Opt level: O0

jsmntok_t * jsmn_alloc_token(jsmn_parser *parser,jsmntok_t *tokens,size_t num_tokens)

{
  uint uVar1;
  jsmntok_t *tok;
  size_t num_tokens_local;
  jsmntok_t *tokens_local;
  jsmn_parser *parser_local;
  jsmntok_t *local_8;
  
  if (parser->toknext < num_tokens) {
    uVar1 = parser->toknext;
    parser->toknext = uVar1 + 1;
    local_8 = tokens + uVar1;
    local_8->end = -1;
    local_8->start = -1;
    local_8->size = 0;
  }
  else {
    local_8 = (jsmntok_t *)0x0;
  }
  return local_8;
}

Assistant:

static jsmntok_t *jsmn_alloc_token(jsmn_parser *parser,
		jsmntok_t *tokens, size_t num_tokens) {
	jsmntok_t *tok;
	if (parser->toknext >= num_tokens) {
		return NULL;
	}
	tok = &tokens[parser->toknext++];
	tok->start = tok->end = -1;
	tok->size = 0;
#ifdef JSMN_PARENT_LINKS
	tok->parent = -1;
#endif
	return tok;
}